

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O3

SampledSpectrum __thiscall
pbrt::Vertex::Le(Vertex *this,
                vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *infiniteLights,
                Vertex *v,SampledWavelengths *lambda)

{
  undefined8 uVar1;
  VertexType VVar2;
  pointer pLVar3;
  ulong uVar4;
  float fVar5;
  float fVar6;
  uint uVar7;
  uint *puVar8;
  pointer pLVar9;
  DiffuseAreaLight *this_00;
  float fVar10;
  float fVar16;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar18 [16];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  float fVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  Point3f p;
  undefined1 auVar29 [16];
  SampledSpectrum SVar32;
  Vector3f w;
  Ray local_58;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  undefined1 auVar17 [56];
  undefined8 uVar37;
  undefined8 uVar38;
  undefined8 uVar39;
  undefined8 uVar40;
  undefined1 auVar22 [56];
  
  VVar2 = this->type;
  if ((VVar2 == Light) ||
     ((VVar2 == Surface &&
      (((this->field_2).si.areaLight.
        super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
        .bits & 0xffffffffffff) != 0)))) {
    auVar27 = vinsertps_avx(*(undefined1 (*) [16])&v->field_2,
                            ZEXT416((uint)(v->field_2).ei.super_Interaction.pi.
                                          super_Point3<pbrt::Interval>.
                                          super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high),0x10);
    fVar5 = ((this->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
             super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low +
            (this->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
            super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) * 0.5;
    uVar1 = *(undefined8 *)
             &(v->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
              super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
    auVar12 = vinsertps_avx(*(undefined1 (*) [16])&this->field_2,
                            ZEXT416((uint)(this->field_2).ei.super_Interaction.pi.
                                          super_Point3<pbrt::Interval>.
                                          super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high),0x10);
    fVar6 = ((v->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
             super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low +
            (v->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
            super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) * 0.5 - fVar5;
    auVar26._0_4_ = ((float)uVar1 + auVar27._0_4_) * 0.5;
    auVar26._4_4_ = ((float)((ulong)uVar1 >> 0x20) + auVar27._4_4_) * 0.5;
    auVar26._8_4_ = (auVar27._8_4_ + 0.0) * 0.5;
    auVar26._12_4_ = (auVar27._12_4_ + 0.0) * 0.5;
    uVar1 = *(undefined8 *)
             &(this->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
              super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
    fVar10 = ((float)uVar1 + auVar12._0_4_) * 0.5;
    fVar16 = ((float)((ulong)uVar1 >> 0x20) + auVar12._4_4_) * 0.5;
    auVar12 = vsubps_avx(auVar26,CONCAT412((auVar12._12_4_ + 0.0) * 0.5,
                                           CONCAT48((auVar12._8_4_ + 0.0) * 0.5,
                                                    CONCAT44(fVar16,fVar10))));
    auVar27._0_4_ = auVar12._0_4_ * auVar12._0_4_;
    auVar27._4_4_ = auVar12._4_4_ * auVar12._4_4_;
    auVar27._8_4_ = auVar12._8_4_ * auVar12._8_4_;
    auVar27._12_4_ = auVar12._12_4_ * auVar12._12_4_;
    auVar27 = vhaddps_avx(auVar27,auVar27);
    fVar25 = auVar27._0_4_ + fVar6 * fVar6;
    if ((fVar25 != 0.0) || (NAN(fVar25))) {
      auVar27 = vsqrtss_avx(ZEXT416((uint)fVar25),ZEXT416((uint)fVar25));
      fVar25 = auVar27._0_4_;
      auVar28._4_4_ = fVar25;
      auVar28._0_4_ = fVar25;
      auVar28._8_4_ = fVar25;
      auVar28._12_4_ = fVar25;
      w.super_Tuple3<pbrt::Vector3,_float>.z = fVar6 / fVar25;
      auVar27 = vdivps_avx(auVar12,auVar28);
      w.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar27._0_8_;
      if ((VVar2 == Light) &&
         ((puVar8 = (uint *)((ulong)(this->field_2).ei.field_0 & 0xffffffffffff),
          puVar8 == (uint *)0x0 || ((*puVar8 & 0xfffffffd) == 1)))) {
        pLVar9 = (infiniteLights->
                 super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pLVar3 = (infiniteLights->
                 super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        if (pLVar9 == pLVar3) {
          auVar31._0_4_ = 0.0;
          auVar36._4_4_ = 0.0;
          register0x00001240 = 0.0;
          register0x00001244 = 0.0;
          return (SampledSpectrum)auVar31;
        }
        auVar24._0_8_ = w.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
        auVar24._8_4_ = auVar27._8_4_ ^ 0x80000000;
        auVar24._12_4_ = auVar27._12_4_ ^ 0x80000000;
        fVar25 = -w.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar27 = ZEXT816(0) << 0x40;
        do {
          uVar1 = *(undefined8 *)
                   &(this->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
                    super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
          auVar12 = vinsertps_avx(*(undefined1 (*) [16])&this->field_2,
                                  ZEXT416((uint)(this->field_2).ei.super_Interaction.pi.
                                                super_Point3<pbrt::Interval>.
                                                super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high),
                                  0x10);
          auVar11._0_4_ = ((float)uVar1 + auVar12._0_4_) * 0.5;
          auVar11._4_4_ = ((float)((ulong)uVar1 >> 0x20) + auVar12._4_4_) * 0.5;
          auVar11._8_4_ = (auVar12._8_4_ + 0.0) * 0.5;
          auVar11._12_4_ = (auVar12._12_4_ + 0.0) * 0.5;
          local_58.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar11);
          auVar12 = ZEXT416(0) << 0x20;
          auVar17 = ZEXT456(0);
          local_58.o.super_Tuple3<pbrt::Point3,_float>.z =
               ((this->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
                super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low +
               (this->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
               super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) * 0.5;
          local_58.d.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar24);
          local_58.time = 0.0;
          local_58.medium.
          super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
          .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                   )0;
          auVar18._0_12_ = ZEXT812(0);
          auVar18._12_4_ = 0;
          auVar22 = ZEXT456(0);
          uVar4 = (pLVar9->
                  super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
                  ).bits;
          uVar7 = (uint)(ushort)(uVar4 >> 0x30);
          if (6 < uVar7) {
            uVar7 = uVar7 - 6;
            local_58.d.super_Tuple3<pbrt::Vector3,_float>.z = fVar25;
            if (uVar7 < 2) {
              SVar32 = UniformInfiniteLight::Le
                                 ((UniformInfiniteLight *)(uVar4 & 0xffffffffffff),&local_58,lambda)
              ;
              auVar19._0_8_ = SVar32.values.values._8_8_;
              auVar19._8_56_ = auVar22;
              auVar18 = auVar19._0_16_;
              auVar13._0_8_ = SVar32.values.values._0_8_;
              auVar13._8_56_ = auVar17;
              auVar12 = auVar13._0_16_;
            }
            else if (uVar7 == 2) {
              SVar32 = ImageInfiniteLight::Le
                                 ((ImageInfiniteLight *)(uVar4 & 0xffffffffffff),&local_58,lambda);
              auVar20._0_8_ = SVar32.values.values._8_8_;
              auVar20._8_56_ = auVar22;
              auVar18 = auVar20._0_16_;
              auVar14._0_8_ = SVar32.values.values._0_8_;
              auVar14._8_56_ = auVar17;
              auVar12 = auVar14._0_16_;
            }
            else {
              SVar32 = PortalImageInfiniteLight::Le
                                 ((PortalImageInfiniteLight *)(uVar4 & 0xffffffffffff),&local_58,
                                  lambda);
              auVar21._0_8_ = SVar32.values.values._8_8_;
              auVar21._8_56_ = auVar22;
              auVar18 = auVar21._0_16_;
              auVar15._0_8_ = SVar32.values.values._0_8_;
              auVar15._8_56_ = auVar17;
              auVar12 = auVar15._0_16_;
            }
          }
          auVar12 = vmovlhps_avx(auVar12,auVar18);
          pLVar9 = pLVar9 + 1;
          auVar23._0_4_ = auVar12._0_4_ + auVar27._0_4_;
          auVar23._4_4_ = auVar12._4_4_ + auVar27._4_4_;
          auVar23._8_4_ = auVar12._8_4_ + auVar27._8_4_;
          auVar23._12_4_ = auVar12._12_4_ + auVar27._12_4_;
          auVar27 = auVar23;
        } while (pLVar9 != pLVar3);
        auVar27 = vshufpd_avx(auVar23,auVar23,1);
        auVar30._0_4_ = auVar23._0_4_;
        auVar35._4_4_ = auVar23._4_4_;
        register0x00001240 = (float)auVar27._0_8_;
        register0x00001244 = (float)((ulong)auVar27._0_8_ >> 0x20);
        return (SampledSpectrum)auVar30;
      }
      uVar4 = (this->field_2).si.areaLight.
              super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
              .bits;
      this_00 = (DiffuseAreaLight *)(uVar4 & 0xffffffffffff);
      if (this_00 == (DiffuseAreaLight *)0x0) {
        auVar29._0_4_ = 0.0;
        auVar34._4_4_ = 0.0;
        register0x00001240 = 0.0;
        register0x00001244 = 0.0;
        return (SampledSpectrum)auVar29;
      }
      if ((this_00->super_LightBase).type == Area) {
        if ((short)(uVar4 >> 0x30) != 6) {
          auVar12._0_4_ = 0.0;
          auVar33._4_4_ = 0.0;
          register0x00001240 = 0.0;
          register0x00001244 = 0.0;
          return (SampledSpectrum)auVar12;
        }
        p.super_Tuple3<pbrt::Point3,_float>.z = fVar5;
        p.super_Tuple3<pbrt::Point3,_float>.x = fVar10;
        p.super_Tuple3<pbrt::Point3,_float>.y = fVar16;
        SVar32 = DiffuseAreaLight::L(this_00,p,
                                     (Normal3f)
                                     *(Tuple3<pbrt::Normal3,_float> *)((long)&this->field_2 + 0x28),
                                     (Point2f)(this->field_2).ei.super_Interaction.uv.
                                              super_Tuple2<pbrt::Point2,_float>,w,lambda);
        return (SampledSpectrum)(undefined1  [16])SVar32.values.values;
      }
      LogFatal<char_const(&)[26]>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/lights.h"
                 ,0x2f4,"Check failed: %s",(char (*) [26])"Type() == LightType::Area");
    }
  }
  return (array<float,_4>)(array<float,_4>)ZEXT816(0);
}

Assistant:

SampledSpectrum Le(const std::vector<LightHandle> &infiniteLights, const Vertex &v,
                       const SampledWavelengths &lambda) const {
        if (!IsLight())
            return SampledSpectrum(0.f);
        Vector3f w = v.p() - p();
        if (LengthSquared(w) == 0)
            return SampledSpectrum(0.);
        w = Normalize(w);
        if (IsInfiniteLight()) {
            // Return emitted radiance for infinite light sources
            SampledSpectrum Le(0.f);
            for (const auto &light : infiniteLights)
                Le += light.Le(Ray(p(), -w), lambda);
            return Le;

        } else if (si.areaLight)
            return si.areaLight.L(si.p(), si.n, si.uv, w, lambda);
        else
            return SampledSpectrum(0.f);
    }